

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

QModelIndex * __thiscall QSqlTableModel::indexInQuery(QSqlTableModel *this,QModelIndex *item)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QSqlTableModelPrivate *this_00;
  ModifiedRow *this_01;
  QModelIndex *in_RDX;
  QSqlTableModelPrivate *in_RDI;
  long in_FS_OFFSET;
  int rowOffset;
  QSqlTableModelPrivate *d;
  const_iterator it;
  QMap<int,_QSqlTableModelPrivate::ModifiedRow> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  QSqlTableModelPrivate *this_02;
  uint in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  this_00 = d_func((QSqlTableModel *)0x170c9f);
  QModelIndex::row(in_RDX);
  QMap<int,_QSqlTableModelPrivate::ModifiedRow>::constFind
            (in_stack_ffffffffffffff78,(int *)0x170cdd);
  QMap<int,_QSqlTableModelPrivate::ModifiedRow>::constEnd(in_stack_ffffffffffffff78);
  bVar2 = ::operator!=((const_iterator *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (const_iterator *)in_stack_ffffffffffffff78);
  in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 & 0xffffff;
  if (bVar2) {
    this_01 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::const_iterator::operator->
                        ((const_iterator *)0x170d20);
    bVar2 = QSqlTableModelPrivate::ModifiedRow::insert(this_01);
    in_stack_ffffffffffffffa8 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffa8);
  }
  if ((char)(in_stack_ffffffffffffffa8 >> 0x18) == '\0') {
    QModelIndex::row(in_RDX);
    iVar3 = QSqlTableModelPrivate::insertCount(in_RDI,in_stack_ffffffffffffff84);
    iVar4 = QModelIndex::row(in_RDX);
    iVar4 = iVar4 - iVar3;
    iVar5 = QModelIndex::column(in_RDX);
    QModelIndex::internalPointer(in_RDX);
    QAbstractItemModel::createIndex
              ((QAbstractItemModel *)this_02,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
               (void *)CONCAT44(iVar5,iVar4));
    QSqlQueryModel::indexInQuery
              ((QSqlQueryModel *)this_00,(QModelIndex *)CONCAT44(iVar3,in_stack_ffffffffffffffa8));
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)0x170d40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QModelIndex *)this_02;
}

Assistant:

QModelIndex QSqlTableModel::indexInQuery(const QModelIndex &item) const
{
    Q_D(const QSqlTableModel);
    const auto it = d->cache.constFind(item.row());
    if (it != d->cache.constEnd() && it->insert())
        return QModelIndex();

    const int rowOffset = d->insertCount(item.row());
    return QSqlQueryModel::indexInQuery(createIndex(item.row() - rowOffset, item.column(), item.internalPointer()));
}